

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyFixAnchors(TidyDocImpl *doc,Node *node,Bool wantName,Bool wantId)

{
  Node *pNVar1;
  ctmbstr s1;
  ctmbstr s2;
  byte bVar2;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  uint uVar6;
  AttVal *av;
  AttVal *attr;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      BVar4 = prvTidyIsAnchorElement(doc,node);
      if (BVar4 != no) {
        av = prvTidyAttrGetById(node,TidyAttr_NAME);
        attr = prvTidyAttrGetById(node,TidyAttr_ID);
        if (attr == (AttVal *)0x0 || av == (AttVal *)0x0) {
          if (wantId == no || av == (AttVal *)0x0) {
            if (wantName != no && attr != (AttVal *)0x0) {
              uVar6 = prvTidyNodeAttributeVersions(node,TidyAttr_NAME);
              if ((doc->lexer->versionEmitted & uVar6) == 0) goto LAB_001520a6;
              prvTidyRepairAttrValue(doc,node,"name",attr->value);
              bVar2 = 1;
              goto LAB_001520a8;
            }
            bVar2 = 0;
            bVar3 = false;
          }
          else {
            uVar6 = prvTidyNodeAttributeVersions(node,TidyAttr_ID);
            if ((doc->lexer->versionEmitted & uVar6) == 0) goto LAB_001520a6;
            BVar4 = prvTidyIsValidHTMLID(av->value);
            if (BVar4 == no) {
              uVar6 = 0x24d;
              goto LAB_001520a1;
            }
            prvTidyRepairAttrValue(doc,node,anon_var_dwarf_52e74 + 0x2b,av->value);
            bVar3 = true;
            bVar2 = 0;
          }
        }
        else {
          s1 = av->value;
          s2 = attr->value;
          if (((s2 != (ctmbstr)0x0) != (s1 != (ctmbstr)0x0)) ||
             ((s1 != (ctmbstr)0x0 && s2 != (ctmbstr)0x0 &&
              (iVar5 = prvTidytmbstrcmp(s1,s2), iVar5 != 0)))) {
            uVar6 = 0x242;
LAB_001520a1:
            prvTidyReportAttrError(doc,node,av,uVar6);
          }
LAB_001520a6:
          bVar2 = 0;
LAB_001520a8:
          bVar3 = false;
        }
        if (!(bool)((attr == (AttVal *)0x0 || wantId != no) |
                   (bVar2 ^ 1) & wantName != no & av == (AttVal *)0x0)) {
          if (wantName == no) {
            prvTidyRemoveAnchorByNode(doc,attr->value,node);
          }
          prvTidyRemoveAttribute(doc,node,attr);
        }
        if (((wantName == no) && (av != (AttVal *)0x0)) &&
           (attr != (AttVal *)0x0 || (wantId == no || bVar3))) {
          if (wantId == no) {
            prvTidyRemoveAnchorByNode(doc,av->value,node);
          }
          prvTidyRemoveAttribute(doc,node,av);
        }
      }
      if (node->content != (Node *)0x0) {
        prvTidyFixAnchors(doc,node->content,wantName,wantId);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(FixAnchors)(TidyDocImpl* doc, Node *node, Bool wantName, Bool wantId)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(IsAnchorElement)(doc, node))
        {
            AttVal *name = TY_(AttrGetById)(node, TidyAttr_NAME);
            AttVal *id = TY_(AttrGetById)(node, TidyAttr_ID);
            Bool hadName = name!=NULL;
            Bool hadId = id!=NULL;
            Bool IdEmitted = no;
            Bool NameEmitted = no;

            /* todo: how are empty name/id attributes handled? */

            if (name && id)
            {
                Bool NameHasValue = AttrHasValue(name);
                Bool IdHasValue = AttrHasValue(id);
                if ( (NameHasValue != IdHasValue) ||
                     (NameHasValue && IdHasValue &&
                     TY_(tmbstrcmp)(name->value, id->value) != 0 ) )
                    TY_(ReportAttrError)( doc, node, name, ID_NAME_MISMATCH);
            }
            else if (name && wantId)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_ID )
                    & doc->lexer->versionEmitted)
                {
                    if (TY_(IsValidHTMLID)(name->value))
                    {
                        TY_(RepairAttrValue)(doc, node, "id", name->value);
                        IdEmitted = yes;
                    }
                    else
                        TY_(ReportAttrError)(doc, node, name, INVALID_XML_ID);
                 }
            }
            else if (id && wantName)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_NAME )
                    & doc->lexer->versionEmitted)
                {
                    /* todo: do not assume id is valid */
                    TY_(RepairAttrValue)(doc, node, "name", id->value);
                    NameEmitted = yes;
                }
            }

            if (id && !wantId
                /* make sure that Name has been emitted if requested */
                && (hadName || !wantName || NameEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, id->value, node);
                TY_(RemoveAttribute)(doc, node, id);
            }

            if (name && !wantName
                /* make sure that Id has been emitted if requested */
                && (hadId || !wantId || IdEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, name->value, node);
                TY_(RemoveAttribute)(doc, node, name);
            }
        }

        if (node->content)
            TY_(FixAnchors)(doc, node->content, wantName, wantId);

        node = next;
    }
}